

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

uint64_t helper_cksm(CPUS390XState_conflict *env,uint64_t r1,uint64_t src,uint64_t src_len)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uintptr_t unaff_retaddr;
  
  uVar5 = 0x2000;
  if (src_len < 0x2000) {
    uVar5 = src_len;
  }
  uVar3 = r1 & 0xffffffff;
  uVar6 = (ulong)((uint)uVar5 & 0x3ffc);
  for (uVar4 = 4; uVar4 <= uVar5; uVar4 = uVar4 + 4) {
    uVar1 = cpu_ldl_data_ra_s390x(env,src,unaff_retaddr);
    uVar3 = uVar3 + uVar1;
    src = src + 4;
  }
  switch((uint)uVar5 & 3) {
  case 0:
    break;
  case 1:
    uVar1 = cpu_ldub_data_ra_s390x(env,src,unaff_retaddr);
    uVar3 = uVar3 + (uVar1 << 0x18);
    uVar6 = uVar6 | 1;
    break;
  case 2:
    uVar1 = cpu_lduw_data_ra_s390x(env,src,unaff_retaddr);
    uVar3 = uVar3 + (uVar1 << 0x10);
    uVar6 = uVar6 | 2;
    break;
  case 3:
    uVar1 = cpu_lduw_data_ra_s390x(env,src,unaff_retaddr);
    uVar2 = cpu_ldub_data_ra_s390x(env,src + 2,unaff_retaddr);
    uVar3 = uVar3 + (uVar1 << 0x10) + (ulong)(uVar2 << 8);
    uVar6 = uVar5 | 3;
  }
  for (; uVar3 >> 0x20 != 0; uVar3 = (uVar3 & 0xffffffff) + (uVar3 >> 0x20)) {
  }
  env->cc_op = (uint)(uVar6 != src_len) * 3;
  env->retxl = uVar3;
  return uVar6;
}

Assistant:

uint64_t HELPER(cksm)(CPUS390XState *env, uint64_t r1,
                      uint64_t src, uint64_t src_len)
{
    uintptr_t ra = GETPC();
    uint64_t max_len, len;
    uint64_t cksm = (uint32_t)r1;

    /* Lest we fail to service interrupts in a timely manner, limit the
       amount of work we're willing to do.  For now, let's cap at 8k.  */
    max_len = (src_len > 0x2000 ? 0x2000 : src_len);

    /* Process full words as available.  */
    for (len = 0; len + 4 <= max_len; len += 4, src += 4) {
        cksm += (uint32_t)cpu_ldl_data_ra(env, src, ra);
    }

    switch (max_len - len) {
    case 1:
        cksm += cpu_ldub_data_ra(env, src, ra) << 24;
        len += 1;
        break;
    case 2:
        cksm += cpu_lduw_data_ra(env, src, ra) << 16;
        len += 2;
        break;
    case 3:
        cksm += cpu_lduw_data_ra(env, src, ra) << 16;
        cksm += cpu_ldub_data_ra(env, src + 2, ra) << 8;
        len += 3;
        break;
    }

    /* Fold the carry from the checksum.  Note that we can see carry-out
       during folding more than once (but probably not more than twice).  */
    while (cksm > 0xffffffffull) {
        cksm = (uint32_t)cksm + (cksm >> 32);
    }

    /* Indicate whether or not we've processed everything.  */
    env->cc_op = (len == src_len ? 0 : 3);

    /* Return both cksm and processed length.  */
    env->retxl = cksm;
    return len;
}